

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O2

aiNode * ImportNode(aiScene *pScene,Asset *r,
                   vector<unsigned_int,_std::allocator<unsigned_int>_> *meshOffsets,
                   Ref<glTF2::Node> *ptr)

{
  Node *node;
  pointer pRVar1;
  pointer pRVar2;
  pointer pRVar3;
  pointer pRVar4;
  Skin *pSVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  Accessor *pAVar8;
  size_t sVar9;
  vector<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_> *pvVar10;
  long lVar11;
  long *plVar12;
  pointer pvVar13;
  undefined4 uVar14;
  int iVar15;
  aiNode *this;
  aiNode **ppaVar16;
  aiNode *paVar17;
  uint *puVar18;
  aiBone **ppaVar19;
  uint8_t *puVar20;
  void *__dest;
  void *pvVar21;
  size_t sVar22;
  aiBone *this_00;
  aiVertexWeight *paVar23;
  vector<glTF2::Light_*,_std::allocator<glTF2::Light_*>_> *pvVar24;
  aiMetadata *this_01;
  long lVar25;
  char *pcVar26;
  uint uVar27;
  pointer puVar28;
  void *pvVar29;
  ulong uVar30;
  ulong uVar31;
  size_t i_1;
  ulong uVar32;
  aiMesh *paVar33;
  ulong uVar34;
  void *pvVar35;
  ulong uVar36;
  long lVar37;
  long lVar38;
  void *pvVar39;
  uint i;
  uint uVar40;
  ulong uVar41;
  bool bVar42;
  void *local_d0;
  long local_b8;
  char postfix [10];
  mat4 *pbindMatrices;
  float weight;
  undefined4 uStack_8c;
  ulong local_88;
  aiMesh *local_70;
  vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
  weighting;
  
  node = (ptr->vector->super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>)._M_impl.
         super__Vector_impl_data._M_start[ptr->index];
  this = (aiNode *)operator_new(0x478);
  GetNodeName_abi_cxx11_((string *)&weight,node);
  aiNode::aiNode(this,(string *)&weight);
  std::__cxx11::string::~string((string *)&weight);
  pRVar1 = (node->children).
           super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (node->children).
           super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pRVar1 != pRVar2) {
    uVar30 = (long)pRVar2 - (long)pRVar1;
    uVar32 = uVar30 >> 4;
    this->mNumChildren = (uint)uVar32;
    ppaVar16 = (aiNode **)operator_new__(uVar30 >> 1 & 0x7fffffff8);
    this->mChildren = ppaVar16;
    lVar37 = 0;
    for (uVar30 = 0; uVar30 < (uVar32 & 0xffffffff); uVar30 = uVar30 + 1) {
      paVar17 = ImportNode(pScene,r,meshOffsets,
                           (Ref<glTF2::Node> *)
                           ((long)&((node->children).
                                    super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->vector + lVar37));
      paVar17->mParent = this;
      this->mChildren[uVar30] = paVar17;
      uVar32 = (ulong)this->mNumChildren;
      lVar37 = lVar37 + 0x10;
    }
  }
  GetNodeTransform(&this->mTransformation,node);
  pRVar3 = (node->meshes).
           super__Vector_base<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar4 = (node->meshes).
           super__Vector_base<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pRVar3 != pRVar4) {
    if ((long)pRVar4 - (long)pRVar3 != 0x10) {
      __assert_fail("node.meshes.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/glTF2/glTF2Importer.cpp"
                    ,0x375,
                    "aiNode *ImportNode(aiScene *, glTF2::Asset &, std::vector<unsigned int> &, glTF2::Ref<glTF2::Node> &)"
                   );
    }
    lVar37 = (long)(int)pRVar3->index;
    puVar28 = (meshOffsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
              .super__Vector_impl_data._M_start;
    uVar40 = puVar28[lVar37 + 1] - puVar28[lVar37];
    this->mNumMeshes = uVar40;
    uVar30 = 0xffffffffffffffff;
    if (-1 < (int)uVar40) {
      uVar30 = (long)(int)uVar40 * 4;
    }
    puVar18 = (uint *)operator_new__(uVar30);
    this->mMeshes = puVar18;
    if ((node->skin).vector != (vector<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_> *)0x0) {
      uVar32 = 0;
      uVar30 = (ulong)uVar40;
      if ((int)uVar40 < 1) {
        uVar30 = uVar32;
      }
      for (; uVar32 != uVar30; uVar32 = uVar32 + 1) {
        paVar33 = pScene->mMeshes
                  [(meshOffsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start[lVar37] + (int)uVar32];
        pSVar5 = (((node->skin).vector)->
                 super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[(node->skin).index];
        uVar31 = (long)*(pointer *)
                        ((long)&(pSVar5->jointNames).
                                super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                        + 8) -
                 *(long *)&(pSVar5->jointNames).
                           super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                           ._M_impl;
        paVar33->mNumBones = (uint)(uVar31 >> 4);
        ppaVar19 = (aiBone **)operator_new__(uVar31 >> 1 & 0x7fffffff8);
        paVar33->mBones = ppaVar19;
        std::
        vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
        ::vector(&weighting,(ulong)paVar33->mNumBones,(allocator_type *)&weight);
        pRVar3 = (node->meshes).
                 super__Vector_base<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar38 = *(long *)(*(long *)(*(long *)&(pRVar3->vector->
                                               super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>
                                               )._M_impl + (ulong)pRVar3->index * 8) + 0x50);
        lVar25 = uVar32 * 0x100;
        puVar6 = *(undefined8 **)(lVar38 + 0xb0 + lVar25);
        local_70 = paVar33;
        if (puVar6 != *(undefined8 **)(lVar38 + 0xb8 + lVar25)) {
          lVar38 = lVar38 + lVar25;
          puVar7 = *(undefined8 **)(lVar38 + 0x80);
          if (puVar7 != *(undefined8 **)(lVar38 + 0x88)) {
            pAVar8 = *(Accessor **)(*(long *)*puVar6 + (ulong)*(uint *)(puVar6 + 1) * 8);
            sVar9 = pAVar8->count;
            if (sVar9 == *(size_t *)
                          (*(long *)(*(long *)*puVar7 + (ulong)*(uint *)(puVar7 + 1) * 8) + 0x70)) {
              puVar20 = glTF2::Accessor::GetPointer(pAVar8);
              if (puVar20 == (uint8_t *)0x0) {
                local_d0 = (void *)0x0;
              }
              else {
                uVar40 = glTF2::Accessor::GetElementSize(pAVar8);
                uVar41 = (ulong)uVar40;
                pvVar10 = (pAVar8->bufferView).vector;
                uVar31 = uVar41;
                if ((pvVar10 !=
                     (vector<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_> *)0x0) &&
                   (uVar31 = (ulong)(pvVar10->
                                    super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start
                                    [(pAVar8->bufferView).index]->byteStride, uVar31 == 0)) {
                  uVar31 = uVar41;
                }
                if (0x10 < uVar40) {
                  pcVar26 = "bool glTF2::Accessor::ExtractData(T *&) [T = Weights]";
                  goto LAB_0056a379;
                }
                uVar36 = pAVar8->count;
                uVar34 = (pvVar10->
                         super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>
                         )._M_impl.super__Vector_impl_data._M_start[(pAVar8->bufferView).index]->
                         byteLength;
                if (uVar34 <= uVar31 * uVar36 && uVar31 * uVar36 - uVar34 != 0) {
                  pcVar26 = "bool glTF2::Accessor::ExtractData(T *&) [T = Weights]";
                  goto LAB_0056a35a;
                }
                local_d0 = operator_new__(-(ulong)(uVar36 >> 0x3c != 0) | uVar36 << 4);
                pvVar21 = local_d0;
                if ((uVar40 == 0x10) && ((int)uVar31 == 0x10)) {
                  memcpy(local_d0,puVar20,uVar36 * uVar41);
                }
                else {
                  while (bVar42 = uVar36 != 0, uVar36 = uVar36 - 1, bVar42) {
                    memcpy(pvVar21,puVar20,uVar41);
                    puVar20 = puVar20 + uVar31;
                    pvVar21 = (void *)((long)pvVar21 + 0x10);
                  }
                }
              }
              uVar40 = glTF2::Accessor::GetElementSize
                                 (*(Accessor **)
                                   (*(long *)**(undefined8 **)(lVar38 + 0x80) +
                                   (ulong)*(uint *)(*(undefined8 **)(lVar38 + 0x80) + 1) * 8));
              pAVar8 = *(Accessor **)
                        (*(long *)**(undefined8 **)(lVar38 + 0x80) +
                        (ulong)*(uint *)(*(undefined8 **)(lVar38 + 0x80) + 1) * 8);
              puVar20 = glTF2::Accessor::GetPointer(pAVar8);
              if (uVar40 == 4) {
                if (puVar20 == (uint8_t *)0x0) {
LAB_0056a2ca:
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/glTF2/glTF2Importer.cpp"
                                ,0x347,
                                "void BuildVertexWeightMapping(Mesh::Primitive &, std::vector<std::vector<aiVertexWeight>> &)"
                               );
                }
                uVar40 = glTF2::Accessor::GetElementSize(pAVar8);
                uVar41 = (ulong)uVar40;
                pvVar10 = (pAVar8->bufferView).vector;
                uVar31 = uVar41;
                if ((pvVar10 !=
                     (vector<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_> *)0x0) &&
                   (uVar31 = (ulong)(pvVar10->
                                    super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start
                                    [(pAVar8->bufferView).index]->byteStride, uVar31 == 0)) {
                  uVar31 = uVar41;
                }
                if (4 < uVar40) {
                  pcVar26 = "bool glTF2::Accessor::ExtractData(T *&) [T = Indices8]";
LAB_0056a379:
                  __assert_fail("elemSize <= targetElemSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/glTF2/glTF2Asset.inl"
                                ,0x28a,pcVar26);
                }
                uVar36 = pAVar8->count;
                uVar34 = (pvVar10->
                         super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>
                         )._M_impl.super__Vector_impl_data._M_start[(pAVar8->bufferView).index]->
                         byteLength;
                if (uVar34 <= uVar31 * uVar36 && uVar31 * uVar36 - uVar34 != 0) {
                  pcVar26 = "bool glTF2::Accessor::ExtractData(T *&) [T = Indices8]";
LAB_0056a35a:
                  __assert_fail("count*stride <= bufferView->byteLength",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/glTF2/glTF2Asset.inl"
                                ,0x28c,pcVar26);
                }
                __dest = operator_new__(-(ulong)(uVar36 >> 0x3e != 0) | uVar36 * 4);
                if ((uVar40 == 4) && ((int)uVar31 == 4)) {
                  memcpy(__dest,puVar20,uVar36 * uVar41);
                }
                else {
                  for (uVar34 = 0; uVar36 != uVar34; uVar34 = uVar34 + 1) {
                    memcpy((void *)((long)__dest + uVar34 * 4),puVar20,uVar41);
                    puVar20 = puVar20 + uVar31;
                  }
                }
                pvVar21 = (void *)0x0;
              }
              else {
                if (puVar20 == (uint8_t *)0x0) goto LAB_0056a2ca;
                uVar40 = glTF2::Accessor::GetElementSize(pAVar8);
                uVar41 = (ulong)uVar40;
                pvVar10 = (pAVar8->bufferView).vector;
                uVar31 = uVar41;
                if ((pvVar10 !=
                     (vector<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_> *)0x0) &&
                   (uVar31 = (ulong)(pvVar10->
                                    super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start
                                    [(pAVar8->bufferView).index]->byteStride, uVar31 == 0)) {
                  uVar31 = uVar41;
                }
                if (8 < uVar40) {
                  pcVar26 = "bool glTF2::Accessor::ExtractData(T *&) [T = Indices16]";
                  goto LAB_0056a379;
                }
                uVar36 = pAVar8->count;
                uVar34 = (pvVar10->
                         super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>
                         )._M_impl.super__Vector_impl_data._M_start[(pAVar8->bufferView).index]->
                         byteLength;
                if (uVar34 <= uVar31 * uVar36 && uVar31 * uVar36 - uVar34 != 0) {
                  pcVar26 = "bool glTF2::Accessor::ExtractData(T *&) [T = Indices16]";
                  goto LAB_0056a35a;
                }
                pvVar21 = operator_new__(-(ulong)(uVar36 >> 0x3d != 0) | uVar36 * 8);
                if ((uVar40 == 8) && ((int)uVar31 == 8)) {
                  memcpy(pvVar21,puVar20,uVar36 * uVar41);
                }
                else {
                  for (uVar34 = 0; uVar36 != uVar34; uVar34 = uVar34 + 1) {
                    memcpy((void *)(uVar34 * 8 + (long)pvVar21),puVar20,uVar41);
                    puVar20 = puVar20 + uVar31;
                  }
                }
                __dest = (void *)0x0;
              }
              pvVar29 = pvVar21;
              pvVar35 = local_d0;
              pvVar39 = __dest;
              for (sVar22 = 0; sVar22 != sVar9; sVar22 = sVar22 + 1) {
                for (lVar38 = 0; lVar38 != 4; lVar38 = lVar38 + 1) {
                  if (__dest == (void *)0x0) {
                    uVar31 = (ulong)*(ushort *)((long)pvVar29 + lVar38 * 2);
                  }
                  else {
                    uVar31 = (ulong)*(byte *)((long)pvVar39 + lVar38);
                  }
                  weight = *(float *)((long)pvVar35 + lVar38 * 4);
                  if ((0.0 < weight) &&
                     (uVar31 < (ulong)(((long)weighting.
                                              super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)weighting.
                                             super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) / 0x18))) {
                    std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::reserve
                              (weighting.
                               super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar31,8);
                    uVar14 = (undefined4)sVar22;
                    postfix[0] = (char)uVar14;
                    postfix[1] = (char)((uint)uVar14 >> 8);
                    postfix[2] = (char)((uint)uVar14 >> 0x10);
                    postfix[3] = (char)((uint)uVar14 >> 0x18);
                    std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>::
                    emplace_back<unsigned_int,float_const&>
                              ((vector<aiVertexWeight,std::allocator<aiVertexWeight>> *)
                               (weighting.
                                super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar31),(uint *)postfix,
                               &weight);
                  }
                }
                pvVar29 = (void *)((long)pvVar29 + 8);
                pvVar35 = (void *)((long)pvVar35 + 0x10);
                pvVar39 = (void *)((long)pvVar39 + 4);
              }
              if (local_d0 != (void *)0x0) {
                operator_delete__(local_d0);
              }
              paVar33 = local_70;
              if (__dest != (void *)0x0) {
                operator_delete__(__dest);
              }
              if (pvVar21 != (void *)0x0) {
                operator_delete__(pvVar21);
              }
            }
          }
        }
        pbindMatrices = (mat4 *)0x0;
        pSVar5 = (((node->skin).vector)->
                 super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[(node->skin).index];
        glTF2::Accessor::ExtractData<float[16]>
                  (*(Accessor **)
                    (*(long *)&((pSVar5->inverseBindMatrices).vector)->
                               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                    + (ulong)(pSVar5->inverseBindMatrices).index * 8),&pbindMatrices);
        lVar25 = 0;
        lVar38 = 8;
        local_b8 = 0;
        for (uVar31 = 0; uVar31 < paVar33->mNumBones; uVar31 = uVar31 + 1) {
          this_00 = (aiBone *)operator_new(0x450);
          aiBone::aiBone(this_00);
          lVar11 = *(long *)&((((node->skin).vector)->
                              super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>).
                              _M_impl.super__Vector_impl_data._M_start[(node->skin).index]->
                             jointNames).
                             super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                             ._M_impl;
          plVar12 = *(long **)(lVar11 + -8 + lVar38);
          uVar36 = (ulong)*(uint *)(lVar11 + lVar38);
          lVar11 = *(long *)(*plVar12 + uVar36 * 8);
          uVar41 = *(ulong *)(lVar11 + 0x38);
          if (uVar41 == 0) {
            if ((ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                 ::kDefaultName_abi_cxx11_ == '\0') &&
               (iVar15 = __cxa_guard_acquire(&ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                                              ::kDefaultName_abi_cxx11_), iVar15 != 0)) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)
                         &ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                          ::kDefaultName_abi_cxx11_,"bone_",(allocator<char> *)&weight);
              __cxa_atexit(std::__cxx11::string::~string,
                           &ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                            ::kDefaultName_abi_cxx11_,&__dso_handle);
              __cxa_guard_release(&ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                                   ::kDefaultName_abi_cxx11_);
            }
            postfix[8] = '\0';
            postfix[9] = '\0';
            postfix[0] = '\0';
            postfix[1] = '\0';
            postfix[2] = '\0';
            postfix[3] = '\0';
            postfix[4] = '\0';
            postfix[5] = '\0';
            postfix[6] = '\0';
            postfix[7] = '\0';
            Assimp::ASSIMP_itoa10<10ul>(&postfix,(int32_t)uVar31);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &weight,&ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                                    ::kDefaultName_abi_cxx11_,postfix);
            uVar41 = local_88;
            if (local_88 < 0x400) {
              (this_00->mName).length = (ai_uint32)local_88;
              memcpy((this_00->mName).data,(void *)CONCAT44(uStack_8c,weight),local_88);
              (this_00->mName).data[uVar41] = '\0';
            }
            std::__cxx11::string::~string((string *)&weight);
          }
          else if (uVar41 < 0x400) {
            (this_00->mName).length = (ai_uint32)uVar41;
            memcpy((this_00->mName).data,*(void **)(lVar11 + 0x30),uVar41);
            (this_00->mName).data[uVar41] = '\0';
          }
          GetNodeTransform(&this_00->mOffsetMatrix,*(Node **)(*plVar12 + uVar36 * 8));
          glTFCommon::CopyValue((mat4 *)((long)*pbindMatrices + local_b8),&this_00->mOffsetMatrix);
          pvVar13 = weighting.
                    super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar41 = *(long *)((long)&((weighting.
                                      super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                    )._M_impl.super__Vector_impl_data._M_finish + lVar25) -
                   *(long *)((long)&((weighting.
                                      super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                    )._M_impl.super__Vector_impl_data._M_start + lVar25);
          uVar40 = (uint)(uVar41 >> 3);
          this_00->mNumWeights = uVar40;
          if (uVar40 == 0) {
            paVar23 = (aiVertexWeight *)operator_new__(8);
            this_00->mWeights = paVar23;
            this_00->mNumWeights = 1;
            paVar23->mVertexId = 0;
            paVar23->mWeight = 0.0;
          }
          else {
            uVar41 = uVar41 & 0x7fffffff8;
            paVar23 = (aiVertexWeight *)operator_new__(uVar41);
            memset(paVar23,0,uVar41);
            this_00->mWeights = paVar23;
            memcpy(paVar23,*(void **)((long)&(pvVar13->
                                             super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                             )._M_impl.super__Vector_impl_data._M_start + lVar25),
                   uVar41);
          }
          local_70->mBones[uVar31] = this_00;
          local_b8 = local_b8 + 0x40;
          lVar38 = lVar38 + 0x10;
          lVar25 = lVar25 + 0x18;
          paVar33 = local_70;
        }
        if (pbindMatrices != (mat4 *)0x0) {
          operator_delete__(pbindMatrices);
        }
        std::
        vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
        ::~vector(&weighting);
      }
      puVar28 = (meshOffsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start;
    }
    uVar40 = puVar28[lVar37];
    for (lVar38 = 0; uVar27 = uVar40 + (int)lVar38, uVar27 < puVar28[lVar37 + 1];
        lVar38 = lVar38 + 1) {
      this->mMeshes[lVar38] = uVar27;
      puVar28 = (meshOffsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start;
    }
  }
  if (((node->camera).vector != (vector<glTF2::Camera_*,_std::allocator<glTF2::Camera_*>_> *)0x0) &&
     (paVar17 = (aiNode *)pScene->mCameras[(node->camera).index], paVar17 != this)) {
    uVar40 = (this->mName).length;
    (paVar17->mName).length = uVar40;
    memcpy((paVar17->mName).data,(this->mName).data,(ulong)uVar40);
    (paVar17->mName).data[uVar40] = '\0';
  }
  pvVar24 = (node->light).vector;
  if (pvVar24 != (vector<glTF2::Light_*,_std::allocator<glTF2::Light_*>_> *)0x0) {
    uVar30 = (ulong)(node->light).index;
    paVar17 = (aiNode *)pScene->mLights[uVar30];
    if (paVar17 != this) {
      uVar40 = (this->mName).length;
      (paVar17->mName).length = uVar40;
      memcpy((paVar17->mName).data,(this->mName).data,(ulong)uVar40);
      (paVar17->mName).data[uVar40] = '\0';
      pvVar24 = (node->light).vector;
      uVar30 = (ulong)(node->light).index;
    }
    if (((pvVar24->super__Vector_base<glTF2::Light_*,_std::allocator<glTF2::Light_*>_>)._M_impl.
         super__Vector_impl_data._M_start[uVar30]->range).isPresent == true) {
      this_01 = aiMetadata::Alloc(1);
      this->mMetaData = this_01;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&weight,"PBR_LightRange",(allocator<char> *)&weighting);
      aiMetadata::Set<float>
                (this_01,0,(string *)&weight,
                 &((((node->light).vector)->
                   super__Vector_base<glTF2::Light_*,_std::allocator<glTF2::Light_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[(node->light).index]->range).value);
      std::__cxx11::string::~string((string *)&weight);
    }
  }
  return this;
}

Assistant:

aiNode* ImportNode(aiScene* pScene, glTF2::Asset& r, std::vector<unsigned int>& meshOffsets, glTF2::Ref<glTF2::Node>& ptr)
{
    Node& node = *ptr;

    aiNode* ainode = new aiNode(GetNodeName(node));

    if (!node.children.empty()) {
        ainode->mNumChildren = unsigned(node.children.size());
        ainode->mChildren = new aiNode*[ainode->mNumChildren];

        for (unsigned int i = 0; i < ainode->mNumChildren; ++i) {
            aiNode* child = ImportNode(pScene, r, meshOffsets, node.children[i]);
            child->mParent = ainode;
            ainode->mChildren[i] = child;
        }
    }

    GetNodeTransform(ainode->mTransformation, node);

    if (!node.meshes.empty()) {
        // GLTF files contain at most 1 mesh per node.
        assert(node.meshes.size() == 1);
        int mesh_idx = node.meshes[0].GetIndex();
        int count = meshOffsets[mesh_idx + 1] - meshOffsets[mesh_idx];

        ainode->mNumMeshes = count;
        ainode->mMeshes = new unsigned int[count];

        if (node.skin) {
            for (int primitiveNo = 0; primitiveNo < count; ++primitiveNo) {
                aiMesh* mesh = pScene->mMeshes[meshOffsets[mesh_idx]+primitiveNo];
                mesh->mNumBones = static_cast<unsigned int>(node.skin->jointNames.size());
                mesh->mBones = new aiBone*[mesh->mNumBones];

                // GLTF and Assimp choose to store bone weights differently.
                // GLTF has each vertex specify which bones influence the vertex.
                // Assimp has each bone specify which vertices it has influence over.
                // To convert this data, we first read over the vertex data and pull
                // out the bone-to-vertex mapping.  Then, when creating the aiBones,
                // we copy the bone-to-vertex mapping into the bone.  This is unfortunate
                // both because it's somewhat slow and because, for many applications,
                // we then need to reconvert the data back into the vertex-to-bone
                // mapping which makes things doubly-slow.
                std::vector<std::vector<aiVertexWeight>> weighting(mesh->mNumBones);
                BuildVertexWeightMapping(node.meshes[0]->primitives[primitiveNo], weighting);

                mat4* pbindMatrices = nullptr;
                node.skin->inverseBindMatrices->ExtractData(pbindMatrices);

                for (uint32_t i = 0; i < mesh->mNumBones; ++i) {
                    aiBone* bone = new aiBone();

                    Ref<Node> joint = node.skin->jointNames[i];
                    if (!joint->name.empty()) {
                      bone->mName = joint->name;
                    } else {
                      // Assimp expects each bone to have a unique name.
                      static const std::string kDefaultName = "bone_";
                      char postfix[10] = {0};
                      ASSIMP_itoa10(postfix, i);
                      bone->mName = (kDefaultName + postfix);
                    }
                    GetNodeTransform(bone->mOffsetMatrix, *joint);

                    CopyValue(pbindMatrices[i], bone->mOffsetMatrix);

                    std::vector<aiVertexWeight>& weights = weighting[i];

                    bone->mNumWeights = static_cast<uint32_t>(weights.size());
                    if (bone->mNumWeights > 0) {
                      bone->mWeights = new aiVertexWeight[bone->mNumWeights];
                      memcpy(bone->mWeights, weights.data(), bone->mNumWeights * sizeof(aiVertexWeight));
                    } else {
                      // Assimp expects all bones to have at least 1 weight.
                      bone->mWeights = new aiVertexWeight[1];
                      bone->mNumWeights = 1;
                      bone->mWeights->mVertexId = 0;
                      bone->mWeights->mWeight = 0.f;
                    }
                    mesh->mBones[i] = bone;
                }

                if (pbindMatrices) {
                    delete[] pbindMatrices;
                }
            }
        }

        int k = 0;
        for (unsigned int j = meshOffsets[mesh_idx]; j < meshOffsets[mesh_idx + 1]; ++j, ++k) {
            ainode->mMeshes[k] = j;
        }
    }

    if (node.camera) {
        pScene->mCameras[node.camera.GetIndex()]->mName = ainode->mName;
    }

    if (node.light) {
        pScene->mLights[node.light.GetIndex()]->mName = ainode->mName;

        //range is optional - see https://github.com/KhronosGroup/glTF/tree/master/extensions/2.0/Khronos/KHR_lights_punctual
        //it is added to meta data of parent node, because there is no other place to put it
        if (node.light->range.isPresent)
        {
            ainode->mMetaData = aiMetadata::Alloc(1);
            ainode->mMetaData->Set(0, "PBR_LightRange", node.light->range.value);
        }
    }

    return ainode;
}